

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

namespace_t * __thiscall cs_impl::any::holder<cs::structure>::get_ext(holder<cs::structure> *this)

{
  runtime_error *this_00;
  char *name;
  allocator local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_78,"Target type \"",&local_99);
  cxx_demangle_abi_cxx11_(&local_98,(cs_impl *)"cs::structure",name);
  std::operator+(&local_58,&local_78,&local_98);
  std::operator+(&local_38,&local_58,"\" doesn\'t have extension field.");
  cs::runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

virtual cs::namespace_t &get_ext() const override
			{
				return cs_impl::get_ext<T>();
			}